

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_9::TileBufferTask::execute(TileBufferTask *this)

{
  int iVar1;
  Data *pDVar2;
  pointer ppTVar3;
  TInSliceInfo_conflict *pTVar4;
  long *plVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  PixelType xOffsetForData;
  int iVar8;
  int iVar9;
  int *piVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  ostream *poVar13;
  InputExc *this_00;
  TileBuffer *pTVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  size_t tileLineSize;
  Data *this_01;
  size_t sVar20;
  Box2i tileRange;
  Array<unsigned_int> numPixelsPerScanLine;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  char *readPtr;
  ostream local_1a8 [376];
  
  pDVar2 = this->_ifd;
  pTVar14 = this->_tileBuffer;
  dataWindowForTile((Imf_2_5 *)&tileRange,&pDVar2->tileDesc,*(int *)&(pDVar2->tileOffsets).field_0xc
                    ,*(int *)&(pDVar2->tileOffsets)._offsets.
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                    *(int *)((long)&(pDVar2->tileOffsets)._offsets.
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4),
                    *(int *)&(pDVar2->tileOffsets)._offsets.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                    *(int *)((long)&(pTVar14->exception)._M_string_length + 4),
                    *(int *)&(pTVar14->exception).field_2,
                    *(int *)((long)&(pTVar14->exception).field_2 + 4),
                    *(int *)((long)&(pTVar14->exception).field_2 + 8));
  numPixelsPerScanLine._size = 0;
  numPixelsPerScanLine._data = (uint *)0x0;
  Array<unsigned_int>::resizeErase
            (&numPixelsPerScanLine,(long)((tileRange.max.y - tileRange.min.y) + 1));
  tileLineSize = 0;
  iVar16 = 0;
  for (iVar18 = tileRange.min.y; iVar18 <= tileRange.max.y; iVar18 = iVar18 + 1) {
    numPixelsPerScanLine._data[(long)iVar18 - (long)tileRange.min.y] = 0;
    sVar20 = 0;
    for (iVar17 = tileRange.min.x; iVar17 <= tileRange.max.x; iVar17 = iVar17 + 1) {
      this_01 = (Data *)this->_ifd;
      piVar10 = DeepTiledInputFile::Data::getSampleCount
                          (this_01,iVar17 - tileRange.min.x * this_01->sampleCountXTileCoords,
                           iVar18 - tileRange.min.y * this_01->sampleCountYTileCoords);
      iVar1 = *piVar10;
      uVar19 = 0;
      while( true ) {
        uVar15 = (ulong)uVar19;
        ppTVar3 = (this_01->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_01->slices).
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= uVar15
           ) break;
        pTVar4 = ppTVar3[uVar15];
        if (pTVar4->fill == false) {
          iVar8 = pixelTypeSize(pTVar4->typeInFile);
          iVar9 = pixelTypeSize(*(PixelType *)
                                 ((long)(&this->_ifd->multiPartFile->super_GenericInputFile)[uVar15]
                                        ._vptr_GenericInputFile + 4));
          iVar16 = iVar16 + iVar8 * iVar1;
          sVar20 = (size_t)(uint)((int)sVar20 + iVar9 * iVar1);
          this_01 = (Data *)this->_ifd;
        }
        uVar19 = uVar19 + 1;
      }
      numPixelsPerScanLine._data[(long)iVar18 - (long)tileRange.min.y] =
           numPixelsPerScanLine._data[(long)iVar18 - (long)tileRange.min.y] + iVar1;
    }
    if ((int)tileLineSize < (int)sVar20) {
      tileLineSize = sVar20;
    }
  }
  plVar5 = (long *)(this->_tileBuffer->exception)._M_dataplus._M_p;
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))();
  }
  pCVar11 = Header::compression(&this->_ifd->header);
  pCVar12 = newTileCompressor(*pCVar11,tileLineSize,(ulong)(this->_ifd->tileDesc).ySize,
                              &this->_ifd->header);
  pTVar14 = this->_tileBuffer;
  (pTVar14->exception)._M_dataplus._M_p = (pointer)pCVar12;
  uVar15._0_4_ = pTVar14->dy;
  uVar15._4_4_ = pTVar14->lx;
  if ((pCVar12 == (Compressor *)0x0) || ((ulong)(long)iVar16 <= uVar15)) {
    *(undefined4 *)&(pTVar14->exception)._M_string_length = 1;
    pTVar14->compressor = *(Compressor **)&pTVar14->format;
  }
  else {
    iVar18 = (*pCVar12->_vptr_Compressor[3])(pCVar12);
    pTVar14 = this->_tileBuffer;
    *(int *)&(pTVar14->exception)._M_string_length = iVar18;
    plVar5 = (long *)(pTVar14->exception)._M_dataplus._M_p;
    uVar6._0_4_ = pTVar14->format;
    uVar6._4_4_ = pTVar14->dx;
    local_1c8 = tileRange.min.x;
    iStack_1c4 = tileRange.min.y;
    iStack_1c0 = tileRange.max.x;
    iStack_1bc = tileRange.max.y;
    iVar18 = (**(code **)(*plVar5 + 0x38))(plVar5,uVar6,pTVar14->dy,&local_1c8,&pTVar14->compressor)
    ;
    uVar15 = (ulong)iVar18;
    pTVar14 = this->_tileBuffer;
    pTVar14->dy = (int)uVar15;
    pTVar14->lx = (int)(uVar15 >> 0x20);
  }
  if (uVar15 == (long)iVar16) {
    readPtr = (char *)pTVar14->compressor;
    for (iVar18 = tileRange.min.y; iVar18 <= tileRange.max.y; iVar18 = iVar18 + 1) {
      uVar19 = 0;
      while( true ) {
        pDVar2 = this->_ifd;
        if ((ulong)((long)(pDVar2->tileBuffers).
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)pDVar2->multiPartFile >>
                   3) <= (ulong)uVar19) break;
        pp_Var7 = (&pDVar2->multiPartFile->super_GenericInputFile)[uVar19]._vptr_GenericInputFile;
        if (*(byte *)((long)pp_Var7 + 0x29) == 1) {
          skipChannel(&readPtr,*(PixelType *)((long)pp_Var7 + 4),
                      (ulong)numPixelsPerScanLine._data[iVar18 - tileRange.min.y]);
        }
        else {
          iVar16 = *(int *)&pDVar2[1].header._map._M_t._M_impl.field_0x4;
          if (iVar16 != 0) {
            iVar16 = tileRange.min.y;
          }
          iVar17 = *(int *)&pDVar2[1].header._map._M_t._M_impl;
          if (iVar17 != 0) {
            iVar17 = tileRange.min.x;
          }
          iVar1 = tileRange.min.y;
          if (*(PixelType *)((long)pp_Var7 + 0x3c) == UINT) {
            iVar1 = 0;
          }
          xOffsetForData = *(PixelType *)(pp_Var7 + 7);
          if (*(PixelType *)(pp_Var7 + 7) != UINT) {
            xOffsetForData = tileRange.min.x;
          }
          copyIntoDeepFrameBuffer
                    (&readPtr,(char *)pp_Var7[1],
                     *(char **)((long)&pDVar2[1].super_Mutex.super___mutex_base._M_mutex + 0x10),
                     (ptrdiff_t)
                     pDVar2[1].super_Mutex.super___mutex_base._M_mutex.__data.__list.__prev,
                     (ptrdiff_t)
                     pDVar2[1].super_Mutex.super___mutex_base._M_mutex.__data.__list.__next,iVar18,
                     tileRange.min.x,tileRange.max.x,iVar17,iVar16,xOffsetForData,iVar1,
                     (ptrdiff_t)pp_Var7[4],(ptrdiff_t)pp_Var7[2],(ptrdiff_t)pp_Var7[3],
                     *(bool *)(pp_Var7 + 5),(double)pp_Var7[6],
                     (Format)(this->_tileBuffer->exception)._M_string_length,*(PixelType *)pp_Var7,
                     *(PixelType *)((long)pp_Var7 + 4));
        }
        uVar19 = uVar19 + 1;
      }
    }
    Array<unsigned_int>::~Array(&numPixelsPerScanLine);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&readPtr);
  poVar13 = std::operator<<(local_1a8,"size mismatch when reading deep tile: expected ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar16);
  poVar13 = std::operator<<(poVar13,"bytes of uncompressed data but got ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,(stringstream *)&readPtr);
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                _ifd->tileDesc,
                _ifd->minX, _ifd->maxX,
                _ifd->minY, _ifd->maxY,
                _tileBuffer->dx,
                _tileBuffer->dy,
                _tileBuffer->lx,
                _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase(tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount(x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size(); ++c)
                {
                    // This slice does not exist in the file.
                    if ( !_ifd->slices[c]->fill)
                    {
                          sizeOfTile += count * pixelTypeSize(_ifd->slices[c]->typeInFile);
                          bytesPerLine += count * pixelTypeSize(_ifd->slices[c]->typeInFile);     
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0)
            delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor
                                  (_ifd->header.compression(),
                                   maxBytesPerTileLine,
                                   _ifd->tileDesc.ySize,
                                   _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor && _tileBuffer->dataSize < static_cast<Int64>(sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile
                (_tileBuffer->buffer, _tileBuffer->dataSize,
                 tileRange, _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

	//
	// sanity check data size: the uncompressed data should be exactly 
	// 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
	//
        if (_tileBuffer->dataSize != static_cast<Int64>(sizeOfTile))
	{
		THROW (IEX_NAMESPACE::InputExc, "size mismatch when reading deep tile: expected " << sizeOfTile << "bytes of uncompressed data but got " << _tileBuffer->dataSize);
	}

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char *readPtr = _tileBuffer->uncompressedData;
                                                        // points to where we
                                                        // read from in the
                                                        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                TInSliceInfo &slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0 : tileRange.min.y;
                int xOffsetForSampleCount =
                        (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                        (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (readPtr, slice.pointerArrayBase,
                                             _ifd->sampleCountSliceBase,
                                             _ifd->sampleCountXStride,
                                             _ifd->sampleCountYStride,
                                             y,
                                             tileRange.min.x,
                                             tileRange.max.x,
                                             xOffsetForSampleCount, yOffsetForSampleCount,
                                             xOffsetForData, yOffsetForData,
                                             slice.sampleStride, 
                                             slice.xStride,
                                             slice.yStride,
                                             slice.fill,
                                             slice.fillValue, _tileBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}